

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::util_convertBaseStatToWorking(HModel *this,int *cstat,int *rstat)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int in_EAX;
  int iVar6;
  int iVar7;
  int var;
  ulong uVar8;
  int iVar9;
  
  bVar4 = 0 < this->numCol;
  if (this->numCol < 1) {
    iVar7 = 0;
  }
  else {
    uVar8 = 0;
    iVar7 = 0;
    do {
      if (cstat[uVar8] == 1) {
        (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = 0;
        (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = 0;
        (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] = (int)uVar8;
        iVar7 = iVar7 + 1;
LAB_0012f3d1:
        bVar5 = true;
      }
      else {
        (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = 1;
        iVar9 = cstat[uVar8];
        if (iVar9 == 3) {
LAB_0012f36d:
          (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = 0;
          goto LAB_0012f3d1;
        }
        if (iVar9 == 2) {
          (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = -1;
          goto LAB_0012f3d1;
        }
        if (iVar9 == 0) {
          dVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar8;
          if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0012f36d;
          (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = 1;
          goto LAB_0012f3d1;
        }
        printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",
               (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8],
               (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8],uVar8 & 0xffffffff);
        in_EAX = (int)uVar8 + 1;
        bVar5 = false;
      }
      if (!bVar5) break;
      uVar8 = uVar8 + 1;
      bVar4 = (long)uVar8 < (long)this->numCol;
    } while ((long)uVar8 < (long)this->numCol);
  }
  if (!bVar4) {
    bVar4 = 0 < this->numRow;
    if (0 < this->numRow) {
      iVar9 = -1;
      uVar8 = 0;
      do {
        iVar6 = this->numCol + (int)uVar8;
        if (rstat[uVar8] == 1) {
          (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] = 0;
          (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] = 0;
          (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7] = iVar6;
          iVar7 = iVar7 + 1;
LAB_0012f4f7:
          bVar5 = true;
        }
        else {
          (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] = 1;
          iVar3 = rstat[uVar8];
          if (iVar3 == 3) {
LAB_0012f495:
            (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6] = 0;
            goto LAB_0012f4f7;
          }
          if (iVar3 == 2) {
            (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6] = 1;
            goto LAB_0012f4f7;
          }
          if (iVar3 == 0) {
            dVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8];
            pdVar1 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar8;
            if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0012f495;
            (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6] = -1;
            goto LAB_0012f4f7;
          }
          printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",
                 (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8],
                 (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8],uVar8 & 0xffffffff);
          bVar5 = false;
          in_EAX = iVar9;
        }
        if (!bVar5) break;
        uVar8 = uVar8 + 1;
        iVar9 = iVar9 + -1;
        bVar4 = (long)uVar8 < (long)this->numRow;
      } while ((long)uVar8 < (long)this->numRow);
    }
    if (!bVar4) {
      populate_WorkArrays(this);
      mlFg_Update(this,this->mlFg_action_NewBasis);
      in_EAX = 0;
    }
  }
  return in_EAX;
}

Assistant:

int HModel::util_convertBaseStatToWorking(const int* cstat, const int* rstat) {
  int numBasic=0;
  for (int col = 0; col < numCol; col++) {
    int var = col;
    if (cstat[col] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (cstat[col] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (colLower[col] == colUpper[col]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_UP;
	continue;
      }
    }
    else if (cstat[col] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_DN;
      continue;
    }
    else if (cstat[col] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;
    }
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: col=%d, cstat=%d, lower=%g, upper=%g\n",
	     col, cstat[col], colLower[col], colUpper[col]);
#endif
      return col+1;
    }
  }
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    if (rstat[row] == HSOL_BASESTAT_BASIC) {
      nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      basicIndex[numBasic] = var;
      numBasic++;
      continue;
    }
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
    if (rstat[row] == HSOL_BASESTAT_LOWER) {
      //HSOL_BASESTAT_LOWER includes fixed variables
      if (rowLower[row] == rowUpper[row]) {
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
	continue;
      }
      else {
	nonbasicMove[var] = NONBASIC_MOVE_DN;
	continue;
      }
    }
    else if (rstat[row] == HSOL_BASESTAT_UPPER) {
      nonbasicMove[var] = NONBASIC_MOVE_UP;
      continue;}
    else if (rstat[row] == HSOL_BASESTAT_ZERO) {
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
      continue;}
    else {
#ifdef JAJH_dev
      printf("Invalid basis status: row=%d, rstat=%d, lower=%g, upper=%g\n",
	     row, rstat[row], rowLower[row], rowUpper[row]);
#endif
      return -(row+1);}
      printf("convertBaseStatToWorking: row=%d, rstat=%d, lower=%g, upper=%g, nonbasicMove=%d\n",
	     row, rstat[row], rowLower[row], rowUpper[row], nonbasicMove[var]);
  }
  assert(numBasic=numRow);
  populate_WorkArrays();
  mlFg_Update(mlFg_action_NewBasis);
  return 0;
}